

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O1

int run_ping_pong_test(void)

{
  int iVar1;
  undefined8 uVar2;
  pinger_t *pinger;
  undefined8 *puVar3;
  undefined8 unaff_RBX;
  anon_union_232_2_629321f6_for_stream *paVar4;
  int64_t eval_b;
  int64_t eval_a;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  long local_10;
  
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  local_10 = 1;
  if (completed_pingers == 1) {
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    local_10 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (local_10 == iVar1) {
      iVar1 = uv_library_shutdown();
      return iVar1;
    }
  }
  else {
    run_ping_pong_test_cold_1();
  }
  iVar1 = (int)&local_10;
  run_ping_pong_test_cold_2();
  uStack_40 = unaff_RBX;
  pinger = (pinger_t *)malloc(0x168);
  if (pinger == (pinger_t *)0x0) {
    socketpair_pinger_new_cold_11();
LAB_001af2f1:
    socketpair_pinger_new_cold_1();
LAB_001af300:
    socketpair_pinger_new_cold_2();
LAB_001af30f:
    socketpair_pinger_new_cold_3();
LAB_001af31e:
    socketpair_pinger_new_cold_4();
LAB_001af32d:
    socketpair_pinger_new_cold_5();
LAB_001af33c:
    socketpair_pinger_new_cold_10();
LAB_001af341:
    socketpair_pinger_new_cold_6();
LAB_001af350:
    socketpair_pinger_new_cold_7();
  }
  else {
    pinger->vectored_writes = iVar1;
    pinger->pongs = 0;
    pinger->state = 0;
    pinger->pong = PONG;
    uv_default_loop();
    iVar1 = uv_socketpair(1,0,&uStack_48,0x40,0x40);
    if (iVar1 != 0) goto LAB_001af2f1;
    iVar1 = uv_guess_handle(uStack_48);
    if (iVar1 != 7) goto LAB_001af300;
    iVar1 = uv_guess_handle(uStack_44);
    if (iVar1 != 7) goto LAB_001af30f;
    uVar2 = uv_default_loop();
    paVar4 = &pinger->stream;
    iVar1 = uv_tcp_init(uVar2,paVar4);
    if (iVar1 != 0) goto LAB_001af31e;
    (pinger->stream).tcp.data = pinger;
    iVar1 = uv_tcp_open(paVar4,uStack_44);
    if (iVar1 != 0) goto LAB_001af32d;
    puVar3 = (undefined8 *)malloc(0xd8);
    if (puVar3 == (undefined8 *)0x0) goto LAB_001af33c;
    *puVar3 = 0;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,puVar3);
    if (iVar1 != 0) goto LAB_001af341;
    iVar1 = uv_tcp_open(puVar3,uStack_48);
    if (iVar1 != 0) goto LAB_001af350;
    pinger_write_ping(pinger);
    iVar1 = uv_read_start(paVar4,alloc_cb,pinger_read_cb);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(puVar3,alloc_cb,ponger_read_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001af36e;
    }
  }
  socketpair_pinger_new_cold_8();
LAB_001af36e:
  socketpair_pinger_new_cold_9();
  tcp_pinger_new(1);
  run_ping_pong_test();
  completed_pingers = 0;
  socketpair_pinger_new(1);
  run_ping_pong_test();
  return 0;
}

Assistant:

static int run_ping_pong_test(void) {
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, completed_pingers);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}